

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  char *pcVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  undefined1 local_540 [6];
  _Bool foundAuthInt;
  _Bool foundAuth;
  Curl_str out;
  char *token;
  char content [1024];
  char value [256];
  _Bool before;
  digestdata *digest_local;
  char *chlg_local;
  
  pcVar1 = digest->nonce;
  digest_local = (digestdata *)chlg;
  Curl_auth_digest_cleanup(digest);
  do {
    while( true ) {
      bVar6 = false;
      if ((*(char *)&digest_local->nonce != '\0') &&
         (bVar6 = true, *(char *)&digest_local->nonce != ' ')) {
        bVar6 = *(char *)&digest_local->nonce == '\t';
      }
      if (!bVar6) break;
      digest_local = (digestdata *)((long)&digest_local->nonce + 1);
    }
    _Var3 = Curl_auth_digest_get_pair
                      ((char *)digest_local,content + 0x3f8,(char *)&token,(char **)&digest_local);
    if (!_Var3) {
      if ((pcVar1 != (char *)0x0) && ((digest->field_0x35 & 1) == 0)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce == (char *)0x0) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if ((digest->qop == (char *)0x0) && ((digest->algo & 1) != 0)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      return CURLE_OK;
    }
    iVar4 = curl_strequal(content + 0x3f8,"nonce");
    if (iVar4 == 0) {
      iVar4 = curl_strequal(content + 0x3f8,"stale");
      if (iVar4 == 0) {
        iVar4 = curl_strequal(content + 0x3f8,"realm");
        if (iVar4 == 0) {
          iVar4 = curl_strequal(content + 0x3f8,"opaque");
          if (iVar4 == 0) {
            iVar4 = curl_strequal(content + 0x3f8,"qop");
            if (iVar4 == 0) {
              iVar4 = curl_strequal(content + 0x3f8,"algorithm");
              if (iVar4 == 0) {
                iVar4 = curl_strequal(content + 0x3f8,"userhash");
                if ((iVar4 != 0) && (iVar4 = curl_strequal((char *)&token,"true"), iVar4 != 0)) {
                  digest->field_0x35 = digest->field_0x35 & 0xfd | 2;
                }
              }
              else {
                (*Curl_cfree)(digest->algorithm);
                pcVar5 = (*Curl_cstrdup)((char *)&token);
                digest->algorithm = pcVar5;
                if (digest->algorithm == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                iVar4 = curl_strequal((char *)&token,"MD5-sess");
                if (iVar4 == 0) {
                  iVar4 = curl_strequal((char *)&token,"MD5");
                  if (iVar4 == 0) {
                    iVar4 = curl_strequal((char *)&token,"SHA-256");
                    if (iVar4 == 0) {
                      iVar4 = curl_strequal((char *)&token,"SHA-256-SESS");
                      if (iVar4 == 0) {
                        iVar4 = curl_strequal((char *)&token,"SHA-512-256");
                        if (iVar4 == 0) {
                          iVar4 = curl_strequal((char *)&token,"SHA-512-256-SESS");
                          if (iVar4 == 0) {
                            return CURLE_BAD_CONTENT_ENCODING;
                          }
                          digest->algo = '\x05';
                        }
                        else {
                          digest->algo = '\x04';
                        }
                      }
                      else {
                        digest->algo = '\x03';
                      }
                    }
                    else {
                      digest->algo = '\x02';
                    }
                  }
                  else {
                    digest->algo = '\0';
                  }
                }
                else {
                  digest->algo = '\x01';
                }
              }
            }
            else {
              out.len = (size_t)&token;
              bVar6 = false;
              bVar2 = false;
              while( true ) {
                bVar7 = false;
                if ((*(char *)out.len != '\0') && (bVar7 = true, *(char *)out.len != ' ')) {
                  bVar7 = *(char *)out.len == '\t';
                }
                if (!bVar7) break;
                out.len = out.len + 1;
              }
              while (iVar4 = Curl_str_until((char **)&out.len,(Curl_str *)local_540,0x20,','),
                    iVar4 == 0) {
                iVar4 = Curl_str_casecompare((Curl_str *)local_540,"auth");
                if (iVar4 == 0) {
                  iVar4 = Curl_str_casecompare((Curl_str *)local_540,"auth-int");
                  if (iVar4 != 0) {
                    bVar2 = true;
                  }
                }
                else {
                  bVar6 = true;
                }
                iVar4 = Curl_str_single((char **)&out.len,',');
                if (iVar4 != 0) break;
                while( true ) {
                  bVar7 = false;
                  if ((*(char *)out.len != '\0') && (bVar7 = true, *(char *)out.len != ' ')) {
                    bVar7 = *(char *)out.len == '\t';
                  }
                  if (!bVar7) break;
                  out.len = out.len + 1;
                }
              }
              if (bVar6) {
                (*Curl_cfree)(digest->qop);
                pcVar5 = (*Curl_cstrdup)("auth");
                digest->qop = pcVar5;
                if (digest->qop == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
              }
              else if (bVar2) {
                (*Curl_cfree)(digest->qop);
                pcVar5 = (*Curl_cstrdup)("auth-int");
                digest->qop = pcVar5;
                if (digest->qop == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
              }
            }
          }
          else {
            (*Curl_cfree)(digest->opaque);
            pcVar5 = (*Curl_cstrdup)((char *)&token);
            digest->opaque = pcVar5;
            if (digest->opaque == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
        }
        else {
          (*Curl_cfree)(digest->realm);
          pcVar5 = (*Curl_cstrdup)((char *)&token);
          digest->realm = pcVar5;
          if (digest->realm == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      else {
        iVar4 = curl_strequal((char *)&token,"true");
        if (iVar4 != 0) {
          digest->field_0x35 = digest->field_0x35 & 0xfe | 1;
          digest->nc = 1;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->nonce);
      pcVar5 = (*Curl_cstrdup)((char *)&token);
      digest->nonce = pcVar5;
      if (digest->nonce == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    while( true ) {
      bVar6 = false;
      if ((*(char *)&digest_local->nonce != '\0') &&
         (bVar6 = true, *(char *)&digest_local->nonce != ' ')) {
        bVar6 = *(char *)&digest_local->nonce == '\t';
      }
      if (!bVar6) break;
      digest_local = (digestdata *)((long)&digest_local->nonce + 1);
    }
    if (*(char *)&digest_local->nonce == ',') {
      digest_local = (digestdata *)((long)&digest_local->nonce + 1);
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISBLANK(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        const char *token = content;
        struct Curl_str out;
        bool foundAuth = FALSE;
        bool foundAuthInt = FALSE;
        /* Pass leading spaces */
        while(*token && ISBLANK(*token))
          token++;
        while(!Curl_str_until(&token, &out, 32, ',')) {
          if(Curl_str_casecompare(&out, DIGEST_QOP_VALUE_STRING_AUTH))
            foundAuth = TRUE;
          else if(Curl_str_casecompare(&out,
                                       DIGEST_QOP_VALUE_STRING_AUTH_INT))
            foundAuthInt = TRUE;
          if(Curl_str_single(&token, ','))
            break;
          while(*token && ISBLANK(*token))
            token++;
        }

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = ALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = ALGO_MD5;
        else if(strcasecompare(content, "SHA-256"))
          digest->algo = ALGO_SHA256;
        else if(strcasecompare(content, "SHA-256-SESS"))
          digest->algo = ALGO_SHA256SESS;
        else if(strcasecompare(content, "SHA-512-256")) {
#ifdef CURL_HAVE_SHA512_256
          digest->algo = ALGO_SHA512_256;
#else  /* ! CURL_HAVE_SHA512_256 */
          return CURLE_NOT_BUILT_IN;
#endif /* ! CURL_HAVE_SHA512_256 */
        }
        else if(strcasecompare(content, "SHA-512-256-SESS")) {
#ifdef CURL_HAVE_SHA512_256
          digest->algo = ALGO_SHA512_256SESS;
#else  /* ! CURL_HAVE_SHA512_256 */
          return CURLE_NOT_BUILT_IN;
#endif /* ! CURL_HAVE_SHA512_256 */
        }
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else if(strcasecompare(value, "userhash")) {
        if(strcasecompare(content, "true")) {
          digest->userhash = TRUE;
        }
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We are done here */

    /* Pass all additional spaces here */
    while(*chlg && ISBLANK(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that is a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  /* "<algo>-sess" protocol versions require "auth" or "auth-int" qop */
  if(!digest->qop && (digest->algo & SESSION_ALGO))
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}